

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test_bqm.hpp
# Opt level: O1

void BQMTester<cimod::Dense>::test_DenseBQMFunctionTest_flip_variable(void)

{
  double dVar1;
  mapped_type *pmVar2;
  mapped_type *pmVar3;
  ulong uVar4;
  char *pcVar5;
  long lVar6;
  ulong uVar7;
  ulong uVar8;
  AssertionResult gtest_ar;
  BQM<uint32_t,_double,_cimod::Dense> bqm;
  Linear<unsigned_int,_double> bqm_linear;
  Quadratic<unsigned_int,_double> bqm_quadratic;
  double offset;
  Quadratic<uint32_t,_double> quadratic;
  Linear<uint32_t,_double> linear;
  key_type local_1c0;
  key_type local_1b8;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *local_1b0;
  AssertHelper local_1a8;
  double local_1a0;
  BinaryQuadraticModel<unsigned_int,_double,_cimod::Dense> local_198;
  _Hashtable<unsigned_int,_std::pair<const_unsigned_int,_double>,_std::allocator<std::pair<const_unsigned_int,_double>_>,_std::__detail::_Select1st,_std::equal_to<unsigned_int>,_std::hash<unsigned_int>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>_>
  local_118;
  _Hashtable<std::pair<unsigned_int,_unsigned_int>,_std::pair<const_std::pair<unsigned_int,_unsigned_int>,_double>,_std::allocator<std::pair<const_std::pair<unsigned_int,_unsigned_int>,_double>_>,_std::__detail::_Select1st,_std::equal_to<std::pair<unsigned_int,_unsigned_int>_>,_cimod::pair_hash,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>_>
  local_e0;
  double local_a8;
  _Hashtable<std::pair<unsigned_int,_unsigned_int>,_std::pair<const_std::pair<unsigned_int,_unsigned_int>,_double>,_std::allocator<std::pair<const_std::pair<unsigned_int,_unsigned_int>,_double>_>,_std::__detail::_Select1st,_std::equal_to<std::pair<unsigned_int,_unsigned_int>_>,_cimod::pair_hash,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>_>
  local_a0;
  _Hashtable<unsigned_int,_std::pair<const_unsigned_int,_double>,_std::allocator<std::pair<const_unsigned_int,_double>_>,_std::__detail::_Select1st,_std::equal_to<unsigned_int>,_std::hash<unsigned_int>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>_>
  local_68;
  
  local_198._quadmat.super_PlainObjectBase<Eigen::Matrix<double,__1,__1,_1,__1,__1>_>.m_storage.
  m_cols = 2;
  local_198._idx_to_label.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)&DAT_4000000000000000;
  local_198._quadmat.super_PlainObjectBase<Eigen::Matrix<double,__1,__1,_1,__1,__1>_>.m_storage.
  m_data = (double *)0x1;
  local_198._quadmat.super_PlainObjectBase<Eigen::Matrix<double,__1,__1,_1,__1,__1>_>.m_storage.
  m_rows = 0x3ff0000000000000;
  std::
  _Hashtable<unsigned_int,std::pair<unsigned_int_const,double>,std::allocator<std::pair<unsigned_int_const,double>>,std::__detail::_Select1st,std::equal_to<unsigned_int>,std::hash<unsigned_int>,std::__detail::_Mod_range_hashing,std::__detail::_Default_ranged_hash,std::__detail::_Prime_rehash_policy,std::__detail::_Hashtable_traits<false,false,true>>
  ::_Hashtable<std::pair<unsigned_int_const,double>const*>
            ((_Hashtable<unsigned_int,std::pair<unsigned_int_const,double>,std::allocator<std::pair<unsigned_int_const,double>>,std::__detail::_Select1st,std::equal_to<unsigned_int>,std::hash<unsigned_int>,std::__detail::_Mod_range_hashing,std::__detail::_Default_ranged_hash,std::__detail::_Prime_rehash_policy,std::__detail::_Hashtable_traits<false,false,true>>
              *)&local_68,&local_198,
             &local_198._idx_to_label.
              super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
              super__Vector_impl_data._M_finish,0,&local_a0,&local_118,&local_e0);
  local_198._quadmat.super_PlainObjectBase<Eigen::Matrix<double,__1,__1,_1,__1,__1>_>.m_storage.
  m_data = (double *)&DAT_200000001;
  local_198._quadmat.super_PlainObjectBase<Eigen::Matrix<double,__1,__1,_1,__1,__1>_>.m_storage.
  m_rows = 0x3fe0000000000000;
  std::
  _Hashtable<std::pair<unsigned_int,unsigned_int>,std::pair<std::pair<unsigned_int,unsigned_int>const,double>,std::allocator<std::pair<std::pair<unsigned_int,unsigned_int>const,double>>,std::__detail::_Select1st,std::equal_to<std::pair<unsigned_int,unsigned_int>>,cimod::pair_hash,std::__detail::_Mod_range_hashing,std::__detail::_Default_ranged_hash,std::__detail::_Prime_rehash_policy,std::__detail::_Hashtable_traits<true,false,true>>
  ::_Hashtable<std::pair<std::pair<unsigned_int,unsigned_int>const,double>const*>
            ((_Hashtable<std::pair<unsigned_int,unsigned_int>,std::pair<std::pair<unsigned_int,unsigned_int>const,double>,std::allocator<std::pair<std::pair<unsigned_int,unsigned_int>const,double>>,std::__detail::_Select1st,std::equal_to<std::pair<unsigned_int,unsigned_int>>,cimod::pair_hash,std::__detail::_Mod_range_hashing,std::__detail::_Default_ranged_hash,std::__detail::_Prime_rehash_policy,std::__detail::_Hashtable_traits<true,false,true>>
              *)&local_a0,&local_198,
             &local_198._quadmat.super_PlainObjectBase<Eigen::Matrix<double,__1,__1,_1,__1,__1>_>.
              m_storage.m_cols,0,&local_118,&local_e0,&local_1b8);
  local_a8 = 0.5;
  cimod::BinaryQuadraticModel<unsigned_int,_double,_cimod::Dense>::BinaryQuadraticModel
            (&local_198,(Linear<unsigned_int,_double> *)&local_68,
             (Quadratic<unsigned_int,_double> *)&local_a0,&local_a8,SPIN);
  local_118._M_buckets._0_4_ = 1;
  cimod::BinaryQuadraticModel<unsigned_int,_double,_cimod::Dense>::flip_variable
            (&local_198,(uint *)&local_118);
  cimod::BinaryQuadraticModel<unsigned_int,_double,_cimod::Dense>::get_linear
            ((Linear<unsigned_int,_double> *)&local_118,&local_198);
  local_e0._M_buckets = &local_e0._M_single_bucket;
  local_e0._M_bucket_count = 1;
  local_e0._M_before_begin._M_nxt = (_Hash_node_base *)0x0;
  local_e0._M_element_count = 0;
  local_e0._M_rehash_policy._M_max_load_factor = 1.0;
  local_e0._M_rehash_policy._M_next_resize = 0;
  local_e0._M_single_bucket = (__node_base_ptr)0x0;
  if ((long)local_198._idx_to_label.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>.
            _M_impl.super__Vector_impl_data._M_finish -
      (long)local_198._idx_to_label.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>.
            _M_impl.super__Vector_impl_data._M_start != 0) {
    uVar4 = (long)local_198._idx_to_label.
                  super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
                  super__Vector_impl_data._M_finish -
            (long)local_198._idx_to_label.
                  super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
                  super__Vector_impl_data._M_start >> 2;
    lVar6 = 0;
    uVar7 = 0;
    do {
      uVar8 = uVar7 + 1;
      if (uVar8 < uVar4) {
        uVar4 = uVar8;
        if ((long)uVar7 < 0) {
LAB_0018809d:
          __assert_fail("row >= 0 && row < rows() && col >= 0 && col < cols()",
                        "/usr/include/eigen3/Eigen/src/Core/DenseCoeffsBase.h",0x77,
                        "CoeffReturnType Eigen::DenseCoeffsBase<Eigen::Matrix<double, -1, -1, 1>, 0>::operator()(Index, Index) const [Derived = Eigen::Matrix<double, -1, -1, 1>, Level = 0]"
                       );
        }
        do {
          if ((((long)uVar4 < 0) ||
              (local_198._quadmat.super_PlainObjectBase<Eigen::Matrix<double,__1,__1,_1,__1,__1>_>.
               m_storage.m_rows <= (long)uVar7)) ||
             (local_198._quadmat.super_PlainObjectBase<Eigen::Matrix<double,__1,__1,_1,__1,__1>_>.
              m_storage.m_cols <= (long)uVar4)) goto LAB_0018809d;
          dVar1 = *(double *)
                   ((long)local_198._quadmat.
                          super_PlainObjectBase<Eigen::Matrix<double,__1,__1,_1,__1,__1>_>.m_storage
                          .m_data +
                   uVar4 * 8 +
                   local_198._quadmat.
                   super_PlainObjectBase<Eigen::Matrix<double,__1,__1,_1,__1,__1>_>.m_storage.m_cols
                   * lVar6);
          if ((dVar1 != 0.0) || (NAN(dVar1))) {
            local_1b8.second =
                 local_198._idx_to_label.
                 super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
                 super__Vector_impl_data._M_start[uVar4];
            local_1b8.first =
                 local_198._idx_to_label.
                 super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
                 super__Vector_impl_data._M_start[uVar7];
            local_1a0 = dVar1;
            pmVar2 = std::__detail::
                     _Map_base<std::pair<unsigned_int,_unsigned_int>,_std::pair<const_std::pair<unsigned_int,_unsigned_int>,_double>,_std::allocator<std::pair<const_std::pair<unsigned_int,_unsigned_int>,_double>_>,_std::__detail::_Select1st,_std::equal_to<std::pair<unsigned_int,_unsigned_int>_>,_cimod::pair_hash,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>,_true>
                     ::operator[]((_Map_base<std::pair<unsigned_int,_unsigned_int>,_std::pair<const_std::pair<unsigned_int,_unsigned_int>,_double>,_std::allocator<std::pair<const_std::pair<unsigned_int,_unsigned_int>,_double>_>,_std::__detail::_Select1st,_std::equal_to<std::pair<unsigned_int,_unsigned_int>_>,_cimod::pair_hash,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>,_true>
                                   *)&local_e0,&local_1b8);
            *pmVar2 = local_1a0;
          }
          uVar4 = uVar4 + 1;
        } while (uVar4 < (ulong)((long)local_198._idx_to_label.
                                       super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>
                                       ._M_impl.super__Vector_impl_data._M_finish -
                                 (long)local_198._idx_to_label.
                                       super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>
                                       ._M_impl.super__Vector_impl_data._M_start >> 2));
      }
      uVar4 = (long)local_198._idx_to_label.
                    super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
                    super__Vector_impl_data._M_finish -
              (long)local_198._idx_to_label.
                    super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
                    super__Vector_impl_data._M_start >> 2;
      lVar6 = lVar6 + 8;
      uVar7 = uVar8;
    } while (uVar8 < uVar4);
  }
  local_1c0.first = 1;
  pmVar3 = std::__detail::
           _Map_base<unsigned_int,_std::pair<const_unsigned_int,_double>,_std::allocator<std::pair<const_unsigned_int,_double>_>,_std::__detail::_Select1st,_std::equal_to<unsigned_int>,_std::hash<unsigned_int>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>,_true>
           ::operator[]((_Map_base<unsigned_int,_std::pair<const_unsigned_int,_double>,_std::allocator<std::pair<const_unsigned_int,_double>_>,_std::__detail::_Select1st,_std::equal_to<unsigned_int>,_std::hash<unsigned_int>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>,_true>
                         *)&local_118,&local_1c0.first);
  testing::internal::CmpHelperFloatingPointEQ<double>
            ((internal *)&local_1b8,"bqm_linear[1]","-1.0",*pmVar3,-1.0);
  if ((char)local_1b8.first == '\0') {
    testing::Message::Message((Message *)&local_1c0);
    if (local_1b0 == (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
      pcVar5 = "";
    }
    else {
      pcVar5 = (local_1b0->_M_dataplus)._M_p;
    }
    testing::internal::AssertHelper::AssertHelper
              (&local_1a8,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/OpenJij[P]cimod/tests/test_bqm.hpp"
               ,0x2cc,pcVar5);
    testing::internal::AssertHelper::operator=(&local_1a8,(Message *)&local_1c0);
    testing::internal::AssertHelper::~AssertHelper(&local_1a8);
    if (local_1c0 != (key_type)0x0) {
      (**(code **)(*(long *)local_1c0 + 8))();
    }
  }
  if (local_1b0 != (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
    std::
    default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
    ::operator()((default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                  *)&local_1b0,local_1b0);
  }
  local_1c0.first = 2;
  pmVar3 = std::__detail::
           _Map_base<unsigned_int,_std::pair<const_unsigned_int,_double>,_std::allocator<std::pair<const_unsigned_int,_double>_>,_std::__detail::_Select1st,_std::equal_to<unsigned_int>,_std::hash<unsigned_int>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>,_true>
           ::operator[]((_Map_base<unsigned_int,_std::pair<const_unsigned_int,_double>,_std::allocator<std::pair<const_unsigned_int,_double>_>,_std::__detail::_Select1st,_std::equal_to<unsigned_int>,_std::hash<unsigned_int>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>,_true>
                         *)&local_118,&local_1c0.first);
  testing::internal::CmpHelperFloatingPointEQ<double>
            ((internal *)&local_1b8,"bqm_linear[2]","2.0",*pmVar3,2.0);
  if ((char)local_1b8.first == '\0') {
    testing::Message::Message((Message *)&local_1c0);
    if (local_1b0 == (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
      pcVar5 = "";
    }
    else {
      pcVar5 = (local_1b0->_M_dataplus)._M_p;
    }
    testing::internal::AssertHelper::AssertHelper
              (&local_1a8,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/OpenJij[P]cimod/tests/test_bqm.hpp"
               ,0x2cd,pcVar5);
    testing::internal::AssertHelper::operator=(&local_1a8,(Message *)&local_1c0);
    testing::internal::AssertHelper::~AssertHelper(&local_1a8);
    if (local_1c0 != (key_type)0x0) {
      (**(code **)(*(long *)local_1c0 + 8))();
    }
  }
  if (local_1b0 != (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
    std::
    default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
    ::operator()((default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                  *)&local_1b0,local_1b0);
  }
  local_1c0 = (key_type)&DAT_200000001;
  pmVar2 = std::__detail::
           _Map_base<std::pair<unsigned_int,_unsigned_int>,_std::pair<const_std::pair<unsigned_int,_unsigned_int>,_double>,_std::allocator<std::pair<const_std::pair<unsigned_int,_unsigned_int>,_double>_>,_std::__detail::_Select1st,_std::equal_to<std::pair<unsigned_int,_unsigned_int>_>,_cimod::pair_hash,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>,_true>
           ::operator[]((_Map_base<std::pair<unsigned_int,_unsigned_int>,_std::pair<const_std::pair<unsigned_int,_unsigned_int>,_double>,_std::allocator<std::pair<const_std::pair<unsigned_int,_unsigned_int>,_double>_>,_std::__detail::_Select1st,_std::equal_to<std::pair<unsigned_int,_unsigned_int>_>,_cimod::pair_hash,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>,_true>
                         *)&local_e0,&local_1c0);
  testing::internal::CmpHelperFloatingPointEQ<double>
            ((internal *)&local_1b8,"bqm_quadratic[std::make_pair(1, 2)]","-0.5",*pmVar2,-0.5);
  if ((char)local_1b8.first == '\0') {
    testing::Message::Message((Message *)&local_1c0);
    if (local_1b0 == (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
      pcVar5 = "";
    }
    else {
      pcVar5 = (local_1b0->_M_dataplus)._M_p;
    }
    testing::internal::AssertHelper::AssertHelper
              (&local_1a8,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/OpenJij[P]cimod/tests/test_bqm.hpp"
               ,0x2ce,pcVar5);
    testing::internal::AssertHelper::operator=(&local_1a8,(Message *)&local_1c0);
    testing::internal::AssertHelper::~AssertHelper(&local_1a8);
    if (local_1c0 != (key_type)0x0) {
      (**(code **)(*(long *)local_1c0 + 8))();
    }
  }
  if (local_1b0 != (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
    std::
    default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
    ::operator()((default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                  *)&local_1b0,local_1b0);
  }
  std::
  _Hashtable<std::pair<unsigned_int,_unsigned_int>,_std::pair<const_std::pair<unsigned_int,_unsigned_int>,_double>,_std::allocator<std::pair<const_std::pair<unsigned_int,_unsigned_int>,_double>_>,_std::__detail::_Select1st,_std::equal_to<std::pair<unsigned_int,_unsigned_int>_>,_cimod::pair_hash,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>_>
  ::~_Hashtable(&local_e0);
  std::
  _Hashtable<unsigned_int,_std::pair<const_unsigned_int,_double>,_std::allocator<std::pair<const_unsigned_int,_double>_>,_std::__detail::_Select1st,_std::equal_to<unsigned_int>,_std::hash<unsigned_int>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>_>
  ::~_Hashtable(&local_118);
  std::
  _Hashtable<unsigned_int,_std::pair<const_unsigned_int,_unsigned_long>,_std::allocator<std::pair<const_unsigned_int,_unsigned_long>_>,_std::__detail::_Select1st,_std::equal_to<unsigned_int>,_std::hash<unsigned_int>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>_>
  ::~_Hashtable(&local_198._label_to_idx._M_h);
  if (local_198._idx_to_label.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>.
      _M_impl.super__Vector_impl_data._M_start != (pointer)0x0) {
    operator_delete(local_198._idx_to_label.
                    super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
                    super__Vector_impl_data._M_start,
                    (long)local_198._idx_to_label.
                          super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
                          super__Vector_impl_data._M_end_of_storage -
                    (long)local_198._idx_to_label.
                          super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
                          super__Vector_impl_data._M_start);
  }
  free(local_198._quadmat.super_PlainObjectBase<Eigen::Matrix<double,__1,__1,_1,__1,__1>_>.m_storage
       .m_data);
  std::
  _Hashtable<std::pair<unsigned_int,_unsigned_int>,_std::pair<const_std::pair<unsigned_int,_unsigned_int>,_double>,_std::allocator<std::pair<const_std::pair<unsigned_int,_unsigned_int>,_double>_>,_std::__detail::_Select1st,_std::equal_to<std::pair<unsigned_int,_unsigned_int>_>,_cimod::pair_hash,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>_>
  ::~_Hashtable(&local_a0);
  std::
  _Hashtable<unsigned_int,_std::pair<const_unsigned_int,_double>,_std::allocator<std::pair<const_unsigned_int,_double>_>,_std::__detail::_Select1st,_std::equal_to<unsigned_int>,_std::hash<unsigned_int>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>_>
  ::~_Hashtable(&local_68);
  return;
}

Assistant:

static void test_DenseBQMFunctionTest_flip_variable()
    {
        Linear<uint32_t, double> linear{{1, 1.0}, {2, 2.0} };
        Quadratic<uint32_t, double> quadratic{ {std::make_pair(1, 2), 0.5} };
        double offset = 0.5;
        Vartype vartype = Vartype::SPIN;

        BQM<uint32_t, double, DataType> bqm(linear, quadratic, offset, vartype);

        bqm.flip_variable(1);
        auto bqm_linear = bqm.get_linear();
        auto bqm_quadratic = bqm.get_quadratic();

        // check biases
        EXPECT_DOUBLE_EQ(bqm_linear[1], -1.0);
        EXPECT_DOUBLE_EQ(bqm_linear[2], 2.0);
        EXPECT_DOUBLE_EQ(bqm_quadratic[std::make_pair(1, 2)], -0.5);
    }